

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

EVP_PKEY * EVP_parse_private_key(CBS *cbs)

{
  _func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *p_Var1;
  int iVar2;
  EVP_PKEY_ASN1_METHOD *method;
  _Head_base<0UL,_evp_pkey_st_*,_false> pkey;
  pointer __p;
  int line;
  UniquePtr<EVP_PKEY> ret;
  uint64_t version;
  CBS pkcs8;
  CBS algorithm;
  CBS key;
  
  iVar2 = CBS_get_asn1(cbs,&pkcs8,0x20000010);
  if ((((iVar2 == 0) || (iVar2 = CBS_get_asn1_uint64(&pkcs8,&version), iVar2 == 0)) ||
      (version != 0)) ||
     ((iVar2 = CBS_get_asn1(&pkcs8,&algorithm,0x20000010), iVar2 == 0 ||
      (iVar2 = CBS_get_asn1(&pkcs8,&key,4), iVar2 == 0)))) {
    iVar2 = 0x66;
    line = 0x75;
LAB_0017f809:
    ERR_put_error(6,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                  ,line);
    return (EVP_PKEY *)0x0;
  }
  method = parse_key_type(&algorithm);
  if (method == (EVP_PKEY_ASN1_METHOD *)0x0) {
    line = 0x7a;
    iVar2 = 0x80;
    goto LAB_0017f809;
  }
  pkey._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
  ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)pkey._M_head_impl;
  if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)pkey._M_head_impl !=
      (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
    evp_pkey_set_method(pkey._M_head_impl,method);
    p_Var1 = (pkey._M_head_impl)->ameth->priv_decode;
    if (p_Var1 == (_func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *)0x0) {
      pkey._M_head_impl = (evp_pkey_st *)0x0;
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                    ,0x89);
      goto LAB_0017f854;
    }
    iVar2 = (*p_Var1)(pkey._M_head_impl,&algorithm,&key);
    if (iVar2 != 0) {
      ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      goto LAB_0017f854;
    }
  }
  pkey._M_head_impl = (evp_pkey_st *)0x0;
LAB_0017f854:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return pkey._M_head_impl;
}

Assistant:

EVP_PKEY *EVP_parse_private_key(CBS *cbs) {
  // Parse the PrivateKeyInfo.
  CBS pkcs8, algorithm, key;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&pkcs8, &version) ||
      version != 0 ||
      !CBS_get_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pkcs8, &key, CBS_ASN1_OCTETSTRING)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }
  const EVP_PKEY_ASN1_METHOD *method = parse_key_type(&algorithm);
  if (method == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }

  // A PrivateKeyInfo ends with a SET of Attributes which we ignore.

  // Set up an |EVP_PKEY| of the appropriate type.
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  // Call into the type-specific PrivateKeyInfo decoding function.
  if (ret->ameth->priv_decode == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (!ret->ameth->priv_decode(ret.get(), &algorithm, &key)) {
    return nullptr;
  }

  return ret.release();
}